

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O0

_Bool get_section(char *line,char *name,char **value,char *full_line)

{
  _Bool _Var1;
  char *pcVar2;
  size_t sVar3;
  char *pos;
  char local_438 [4];
  int len;
  char buf [1024];
  char *start;
  char *full_line_local;
  char **value_local;
  char *name_local;
  char *line_local;
  
  buf._1016_8_ = line;
  _Var1 = prefix_i(line,name);
  if (_Var1) {
    if (*value == (char *)0x0) {
      pcVar2 = strchr(line,0x3a);
      if (pcVar2 == (char *)0x0) {
        sVar3 = strlen(line);
        pos._4_4_ = (int)sVar3;
      }
      else {
        pos._4_4_ = (int)pcVar2 - (int)line;
      }
      if (line[pos._4_4_ + -1] == ';') {
        pos._4_4_ = pos._4_4_ + -1;
      }
      strncpy(local_438,line,(long)pos._4_4_);
      local_438[pos._4_4_] = '\0';
      pcVar2 = string_make(local_438);
      *value = pcVar2;
      line_local._7_1_ = true;
    }
    else {
      borg_formula_error((char *)buf._1016_8_,full_line,"value","** section repeated");
      line_local._7_1_ = false;
    }
  }
  else {
    line_local._7_1_ = false;
  }
  return line_local._7_1_;
}

Assistant:

static bool get_section(
    char *line, const char *name, char **value, const char *full_line)
{
    char *start = line;
    if (prefix_i(line, name)) {
        char buf[1024];

        /* this value already exists */
        if (*value) {
            borg_formula_error(
                start, full_line, "value", "** section repeated");
            return false;
        }

        int   len;
        char *pos = line;
        line      = strchr(line, ':');
        if (line)
            len = line - pos;
        else
            len = strlen(pos);
        if (pos[len - 1] == ';')
            len--;
        strncpy(buf, pos, len);
        buf[len] = 0;
        *value   = string_make(buf);
        return true;
    }

    return false;
}